

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O0

void __thiscall QUndoStack::setIndex(QUndoStack *this,int idx)

{
  QUndoCommand *pQVar1;
  bool bVar2;
  QUndoStackPrivate *pQVar3;
  qsizetype qVar4;
  const_reference ppQVar5;
  int in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QUndoCommand *cmd_1;
  QUndoCommand *cmd;
  int i;
  QUndoStackPrivate *d;
  QUndoCommand *in_stack_ffffffffffffff88;
  QUndoCommand *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int local_44;
  undefined4 in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QUndoStack *)0xa82fce);
  bVar2 = QList<QUndoCommand_*>::isEmpty((QList<QUndoCommand_*> *)0xa82fe4);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    if (in_ESI < 0) {
      in_ESI = 0;
    }
    else {
      in_stack_ffffffffffffff98 = (char *)(long)in_ESI;
      qVar4 = QList<QUndoCommand_*>::size(&pQVar3->command_list);
      if (qVar4 < (long)in_stack_ffffffffffffff98) {
        qVar4 = QList<QUndoCommand_*>::size(&pQVar3->command_list);
        in_ESI = (int)qVar4;
      }
    }
    local_44 = pQVar3->index;
    while (local_44 < in_ESI) {
      ppQVar5 = QList<QUndoCommand_*>::at
                          ((QList<QUndoCommand_*> *)in_stack_ffffffffffffff90,
                           (qsizetype)in_stack_ffffffffffffff88);
      pQVar1 = *ppQVar5;
      bVar2 = QUndoCommand::isObsolete(pQVar1);
      if (!bVar2) {
        (*pQVar1->_vptr_QUndoCommand[3])();
      }
      bVar2 = QUndoCommand::isObsolete(pQVar1);
      if (bVar2) {
        in_stack_ffffffffffffff90 =
             QList<QUndoCommand_*>::takeAt
                       ((QList<QUndoCommand_*> *)in_RDI,(qsizetype)in_stack_ffffffffffffff98);
        if (in_stack_ffffffffffffff90 != (QUndoCommand *)0x0) {
          (*in_stack_ffffffffffffff90->_vptr_QUndoCommand[1])();
        }
        if (local_44 < pQVar3->clean_index) {
          resetClean((QUndoStack *)in_RDI);
        }
        in_ESI = in_ESI + -1;
      }
      else {
        local_44 = local_44 + 1;
      }
    }
    while (in_ESI < local_44) {
      local_44 = local_44 + -1;
      ppQVar5 = QList<QUndoCommand_*>::at
                          ((QList<QUndoCommand_*> *)in_stack_ffffffffffffff90,
                           (qsizetype)in_stack_ffffffffffffff88);
      pQVar1 = *ppQVar5;
      (*pQVar1->_vptr_QUndoCommand[2])();
      bVar2 = QUndoCommand::isObsolete(pQVar1);
      if (bVar2) {
        in_stack_ffffffffffffff88 =
             QList<QUndoCommand_*>::takeAt
                       ((QList<QUndoCommand_*> *)in_RDI,(qsizetype)in_stack_ffffffffffffff98);
        if (in_stack_ffffffffffffff88 != (QUndoCommand *)0x0) {
          (*in_stack_ffffffffffffff88->_vptr_QUndoCommand[1])();
        }
        if (local_44 < pQVar3->clean_index) {
          resetClean((QUndoStack *)in_RDI);
        }
      }
    }
    QUndoStackPrivate::setIndex
              ((QUndoStackPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)pQVar3 >> 0x20),SUB81((ulong)pQVar3 >> 0x18,0));
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDI,in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
               (char *)in_stack_ffffffffffffff88);
    QMessageLogger::warning
              (local_28,"QUndoStack::setIndex(): cannot set index in the middle of a macro");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUndoStack::setIndex(int idx)
{
    Q_D(QUndoStack);
    if (Q_UNLIKELY(!d->macro_stack.isEmpty())) {
        qWarning("QUndoStack::setIndex(): cannot set index in the middle of a macro");
        return;
    }

    if (idx < 0)
        idx = 0;
    else if (idx > d->command_list.size())
        idx = d->command_list.size();

    int i = d->index;
    while (i < idx) {
        QUndoCommand *cmd = d->command_list.at(i);

        if (!cmd->isObsolete())
            cmd->redo();  // A separate check is done b/c the undo command may set obsolete flag

        if (cmd->isObsolete()) {
            delete d->command_list.takeAt(i);

            if (d->clean_index > i)
                resetClean();

            idx--; // Subtract from idx because we removed a command
        } else {
            i++;
        }
    }

    while (i > idx) {
        QUndoCommand *cmd = d->command_list.at(--i);

        cmd->undo();
        if (cmd->isObsolete()) {
            delete d->command_list.takeAt(i);

            if (d->clean_index > i)
                resetClean();
        }
    }

    d->setIndex(idx, false);
}